

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

void intgemm::CompareEps<float>(float *reference,float *actual,Index size,float epsilon)

{
  ulong uVar1;
  float threshold;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage1;
  float local_174;
  SourceLineInfo local_170;
  float local_15c;
  float local_158;
  float local_154;
  float *local_150;
  ITransientExpression local_148;
  float *local_138;
  char *local_130;
  size_t sStack_128;
  float *local_120;
  ulong local_118;
  float *local_110;
  StringRef local_108;
  MessageBuilder local_f8;
  undefined1 local_98 [16];
  ScopedMessage local_80;
  
  if (size != 0) {
    local_118 = (ulong)size;
    uVar1 = 0;
    local_15c = epsilon;
    local_150 = actual;
    local_110 = reference;
    do {
      local_148._vptr_ITransientExpression = (_func_int **)(anon_var_dwarf_2352f0 + 9);
      local_148.m_isBinaryExpression = true;
      local_148.m_result = false;
      local_148._10_6_ = 0;
      local_170.file = "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/test.h"
      ;
      local_170.line = 0x28;
      Catch::MessageBuilder::MessageBuilder(&local_f8,(StringRef *)&local_148,&local_170,Info);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_f8.super_MessageStream.m_stream.m_oss,"Inaccurate at ",0xe);
      std::ostream::_M_insert<unsigned_long>((ulong)local_f8.super_MessageStream.m_stream.m_oss);
      local_174._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_f8.super_MessageStream.m_stream.m_oss,(char *)&local_174,1);
      std::ostream::_M_insert<double>((double)reference[uVar1]);
      local_174 = (float)CONCAT31(local_174._1_3_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_f8.super_MessageStream.m_stream.m_oss,(char *)&local_174,1);
      std::ostream::_M_insert<double>((double)local_150[uVar1]);
      Catch::ScopedMessage::ScopedMessage(&local_80,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.m_info.message._M_dataplus._M_p != &local_f8.m_info.message.field_2) {
        operator_delete(local_f8.m_info.message._M_dataplus._M_p);
      }
      Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_f8);
      local_174 = ABS(reference[uVar1]);
      if (local_174 <= 0.01) {
        local_174 = 0.01;
      }
      local_174 = local_174 * local_15c;
      local_148._vptr_ITransientExpression = (_func_int **)0x1b3b11;
      local_148.m_isBinaryExpression = true;
      local_148.m_result = false;
      local_148._10_6_ = 0;
      local_170.file = "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/test.h"
      ;
      local_170.line = 0x2b;
      Catch::StringRef::StringRef(&local_108,"std::fabs(reference[i] - actual[i]) < threshold");
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)&local_f8,(StringRef *)&local_148,&local_170,local_108,
                 ContinueOnFailure);
      local_154 = ABS(reference[uVar1] - local_150[uVar1]);
      local_98 = ZEXT416((uint)local_154);
      local_158 = local_174;
      Catch::StringRef::StringRef((StringRef *)&local_170,"<");
      local_148.m_result = (float)local_98._0_4_ < local_158;
      local_148.m_isBinaryExpression = true;
      local_148._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_001ed7d8;
      local_138 = &local_154;
      local_130 = local_170.file;
      sStack_128 = local_170.line;
      local_120 = &local_174;
      Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_f8,&local_148);
      Catch::ITransientExpression::~ITransientExpression(&local_148);
      Catch::AssertionHandler::complete((AssertionHandler *)&local_f8);
      reference = local_110;
      if (local_f8.m_info.message.field_2._M_local_buf[2] == '\0') {
        (**(code **)(*(long *)local_f8.m_info.message.field_2._8_8_ + 0x70))
                  (local_f8.m_info.message.field_2._8_8_,&local_f8);
      }
      Catch::ScopedMessage::~ScopedMessage(&local_80);
      uVar1 = uVar1 + 1;
    } while (local_118 != uVar1);
  }
  return;
}

Assistant:

void CompareEps(const Type* reference, const Type* actual, Index size, Type epsilon) {
  for (Index i = 0; i < size; ++i) {
    INFO("Inaccurate at " << i << ' ' << reference[i] << ' ' << actual[i]);
    // Ratio to maximum value.
    float threshold = epsilon * std::max<float>(0.01f, std::fabs(reference[i]));
    CHECK(std::fabs(reference[i] - actual[i]) < threshold);
  }
}